

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_extrl_i64_i32_mips64el(TCGContext_conflict6 *tcg_ctx,TCGv_i32 ret,TCGv_i64 arg)

{
  TCGv_i64 arg_local;
  TCGv_i32 ret_local;
  TCGContext_conflict6 *tcg_ctx_local;
  
  tcg_gen_mov_i32(tcg_ctx,ret,(TCGv_i32)arg);
  return;
}

Assistant:

void tcg_gen_extrl_i64_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i64 arg)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_mov_i32(tcg_ctx, ret, TCGV_LOW(tcg_ctx, arg));
#elif TCG_TARGET_HAS_extrl_i64_i32
        tcg_gen_op2(tcg_ctx, INDEX_op_extrl_i64_i32,
                    tcgv_i32_arg(tcg_ctx, ret), tcgv_i64_arg(tcg_ctx, arg));
#else
        tcg_gen_mov_i32(tcg_ctx, ret, (TCGv_i32)arg);
#endif
}